

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O2

int mbedtls_pk_write_pubkey(uchar **p,uchar *start,mbedtls_pk_context *key)

{
  void *pvVar1;
  mbedtls_pk_type_t mVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  mVar2 = mbedtls_pk_get_type(key);
  if (mVar2 == MBEDTLS_PK_RSA) {
    pvVar1 = key->pk_ctx;
    iVar3 = mbedtls_asn1_write_mpi(p,start,(mbedtls_mpi *)((long)pvVar1 + 0x28));
    iVar4 = iVar3;
    if ((-1 < iVar3) &&
       (iVar4 = mbedtls_asn1_write_mpi(p,start,(mbedtls_mpi *)((long)pvVar1 + 0x10)), -1 < iVar4)) {
      uVar5 = iVar4 + iVar3;
      iVar3 = mbedtls_asn1_write_len(p,start,(ulong)uVar5);
      iVar4 = iVar3;
      if ((-1 < iVar3) && (iVar4 = mbedtls_asn1_write_tag(p,start,'0'), -1 < iVar4)) {
        iVar4 = iVar3 + uVar5 + iVar4;
      }
    }
  }
  else {
    mVar2 = mbedtls_pk_get_type(key);
    iVar4 = -0x3980;
    if (mVar2 == MBEDTLS_PK_ECKEY) {
      iVar4 = pk_write_ec_pubkey(p,start,(mbedtls_ecp_keypair *)key->pk_ctx);
      return iVar4;
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_pk_write_pubkey( unsigned char **p, unsigned char *start,
                     const mbedtls_pk_context *key )
{
    int ret;
    size_t len = 0;

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
        MBEDTLS_ASN1_CHK_ADD( len, pk_write_rsa_pubkey( p, start, mbedtls_pk_rsa( *key ) ) );
    else
#endif
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
        MBEDTLS_ASN1_CHK_ADD( len, pk_write_ec_pubkey( p, start, mbedtls_pk_ec( *key ) ) );
    else
#endif
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( (int) len );
}